

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint32_t ExtraCost_C(uint32_t *population,int length)

{
  uint32_t cost;
  int i;
  int length_local;
  uint32_t *population_local;
  
  cost = population[4] + population[5];
  for (i = 2; i < length / 2 + -1; i = i + 1) {
    cost = i * (population[i * 2 + 2] + population[i * 2 + 3]) + cost;
  }
  return cost;
}

Assistant:

static uint32_t ExtraCost_C(const uint32_t* population, int length) {
  int i;
  uint32_t cost = population[4] + population[5];
  assert(length % 2 == 0);
  for (i = 2; i < length / 2 - 1; ++i) {
    cost += i * (population[2 * i + 2] + population[2 * i + 3]);
  }
  return cost;
}